

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_peer_eviction_tests.cpp
# Opt level: O1

bool net_peer_eviction_tests::IsEvicted
               (int number_of_nodes,function<void_(NodeEvictionCandidate_&)> candidate_setup_fn,
               unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
               *node_ids,FastRandomContext *random_context)

{
  vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> candidates;
  bool bVar1;
  undefined8 uVar2;
  FastRandomContext *in_RCX;
  pointer pNVar3;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff98;
  pointer in_stack_ffffffffffffffa0;
  pointer in_stack_ffffffffffffffa8;
  __node_base local_50;
  vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> local_48;
  __node_base_ptr local_30;
  
  local_30 = *(__node_base_ptr *)(in_FS_OFFSET + 0x28);
  GetRandomNodeEvictionCandidates(&local_48,number_of_nodes,in_RCX);
  pNVar3 = local_48.
           super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>._M_impl
           .super__Vector_impl_data._M_start;
  do {
    if (pNVar3 == local_48.
                  super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::vector
                ((vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *)
                 &stack0xffffffffffffffa0,&local_48);
      candidates.super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>.
      _M_impl.super__Vector_impl_data._M_finish = in_stack_ffffffffffffffa0;
      candidates.super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffff98;
      candidates.super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffffa8;
      bVar1 = IsEvicted(candidates,
                        (unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                         *)&stack0xffffffffffffffa0,random_context);
      if (in_stack_ffffffffffffffa0 != (pointer)0x0) {
        operator_delete(in_stack_ffffffffffffffa0,
                        (long)local_50._M_nxt - (long)in_stack_ffffffffffffffa0);
      }
      if (local_48.super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (*(__node_base_ptr *)(in_FS_OFFSET + 0x28) == local_30) {
        return bVar1;
      }
LAB_004ab710:
      __stack_chk_fail();
    }
    if ((node_ids->_M_h)._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
      if (*(__node_base_ptr *)(in_FS_OFFSET + 0x28) == local_30) {
        uVar2 = std::__throw_bad_function_call();
        if (in_stack_ffffffffffffffa0 != (pointer)0x0) {
          operator_delete(in_stack_ffffffffffffffa0,
                          (long)local_50._M_nxt - (long)in_stack_ffffffffffffffa0);
        }
        if (local_48.
            super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.
                          super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_48.
                                super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.
                                super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (*(__node_base_ptr *)(in_FS_OFFSET + 0x28) == local_30) {
          _Unwind_Resume(uVar2);
        }
      }
      goto LAB_004ab710;
    }
    (*(code *)(node_ids->_M_h)._M_element_count)(node_ids,pNVar3);
    pNVar3 = pNVar3 + 1;
  } while( true );
}

Assistant:

bool IsEvicted(const int number_of_nodes, std::function<void(NodeEvictionCandidate&)> candidate_setup_fn, const std::unordered_set<NodeId>& node_ids, FastRandomContext& random_context)
{
    std::vector<NodeEvictionCandidate> candidates = GetRandomNodeEvictionCandidates(number_of_nodes, random_context);
    for (NodeEvictionCandidate& candidate : candidates) {
        candidate_setup_fn(candidate);
    }
    return IsEvicted(candidates, node_ids, random_context);
}